

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_ManyArgs_Test::TestBody(FormatterTest_ManyArgs_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t in_RCX;
  char *pcVar3;
  size_t sVar4;
  char *message;
  int *args;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  basic_string_view<char> format_str_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  AssertionResult gtest_ar_3;
  string format_str;
  string gtest_expected_message;
  AssertionResult local_2e8;
  AssertionResult local_2d8;
  TestFormat<15> local_2c8 [16];
  AssertHelper local_2b8;
  undefined4 local_2ac;
  string local_2a8;
  undefined1 local_288 [504];
  string local_90;
  string local_70;
  string local_50;
  
  format_str_00.size_ = in_RCX;
  format_str_00.data_ = (char *)0x4;
  TestFormat<20>::format<>(&local_2a8,(TestFormat<20> *)"{19}",format_str_00);
  pcVar3 = "19";
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_2d8,"\"19\"","TestFormat<20>::format(\"{19}\")",(char (*) [3])"19",
             &local_2a8);
  paVar1 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((internal)local_2d8.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    if (local_2d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x329;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x329,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((internal)local_2d8.success_ == (internal)0x1) {
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"argument index out of range","");
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2) &&
       (format_str_01.size_ = (size_t)pcVar3, format_str_01.data_ = (char *)0x4,
       TestFormat<20>::format<>(&local_50,(TestFormat<20> *)"{20}",format_str_01),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    testing::AssertionResult::operator<<
              (&local_2d8,
               (char (*) [112])
               "Expected: TestFormat<20>::format(\"{20}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_2a8);
  if (local_2d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    args = (int *)0x24a729;
  }
  else {
    args = (int *)((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x32b,(char *)args);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((internal)local_2d8.success_ == (internal)0x1) {
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"argument index out of range","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_2ac = 0x14;
      format_str_02.size_ = (size_t)&local_2ac;
      format_str_02.data_ = (char *)0x4;
      TestFormat<20>::format<int>(&local_70,(TestFormat<20> *)"{21}",format_str_02,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    testing::AssertionResult::operator<<
              (&local_2d8,
               (char (*) [112])
               "Expected: TestFormat<21>::format(\"{21}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_2a8);
  if (local_2d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x32d,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_2e8.success_ = true;
  local_2e8._1_7_ = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_2a8._M_dataplus._M_p = (pointer)&PTR_grow_002a3c18;
  local_2a8.field_2._8_8_ = 500;
  format_str_04.size_ = 6;
  format_str_04.data_ = "{{{}}}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  sVar4 = fmt::v5::
          format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
          ::TYPES;
  local_2a8._M_string_length = (size_type)local_288;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2a8,format_str_04,args_00,(locale_ref)0x0);
  local_2d8._0_8_ = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,local_2a8._M_string_length,
             (undefined1 *)(local_2a8._M_string_length + local_2a8.field_2._M_allocated_capacity));
  local_2a8._M_dataplus._M_p = (pointer)&PTR_grow_002a3c18;
  if ((undefined1 *)local_2a8._M_string_length != local_288) {
    operator_delete((void *)local_2a8._M_string_length);
  }
  testing::AssertionSuccess();
  if (local_2e8.success_ == true) {
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"argument index out of range","");
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2) &&
       (format_str_03.size_ = sVar4, format_str_03.data_ = (char *)local_2d8.message_.ptr_,
       TestFormat<15>::format<>(&local_90,(TestFormat<15> *)local_2d8._0_8_,format_str_03),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_90._M_dataplus._M_p != &local_90.field_2)) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    testing::AssertionResult::operator<<
              (&local_2e8,
               (char (*) [129])
               "Expected: TestFormat<max_packed_args>::format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_2a8);
  if (local_2e8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_2e8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x331,pcVar3);
  testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2a8);
  testing::internal::AssertHelper::~AssertHelper(&local_2b8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((TestFormat<15> *)local_2d8._0_8_ != local_2c8) {
    operator_delete((void *)local_2d8._0_8_);
  }
  return;
}

Assistant:

TEST(FormatterTest, ManyArgs) {
  EXPECT_EQ("19", TestFormat<20>::format("{19}"));
  EXPECT_THROW_MSG(TestFormat<20>::format("{20}"),
                   format_error, "argument index out of range");
  EXPECT_THROW_MSG(TestFormat<21>::format("{21}"),
                   format_error, "argument index out of range");
  enum { max_packed_args = fmt::internal::max_packed_args };
  std::string format_str = fmt::format("{{{}}}", max_packed_args + 1);
  EXPECT_THROW_MSG(TestFormat<max_packed_args>::format(format_str),
                   format_error, "argument index out of range");
}